

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad-helpers.c
# Opt level: O3

int add_addr_to_dev(pcap_if_t *curdev,sockaddr *addr,size_t addr_size,sockaddr *netmask,
                   size_t netmask_size,sockaddr *broadaddr,size_t broadaddr_size,sockaddr *dstaddr,
                   size_t dstaddr_size,char *errbuf)

{
  pcap_addr *ppVar1;
  pcap_addr *__ptr;
  sockaddr *__dest;
  sockaddr *__dest_00;
  sockaddr *__dest_01;
  sockaddr *__dest_02;
  int *piVar2;
  char *pcVar3;
  pcap_addr *ppVar4;
  
  __ptr = (pcap_addr *)malloc(0x28);
  if (__ptr == (pcap_addr *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = pcap_strerror(*piVar2);
    snprintf(errbuf,0x100,"malloc: %s",pcVar3);
    return -1;
  }
  __ptr->next = (pcap_addr *)0x0;
  if (addr == (sockaddr *)0x0) {
    __dest = (sockaddr *)0x0;
  }
  else {
    __dest = (sockaddr *)malloc(addr_size);
    if (__dest == (sockaddr *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = pcap_strerror(*piVar2);
      snprintf(errbuf,0x100,"malloc: %s",pcVar3);
      goto LAB_00108abd;
    }
    memcpy(__dest,addr,addr_size);
  }
  __ptr->addr = __dest;
  if (netmask == (sockaddr *)0x0) {
    __dest_00 = (sockaddr *)0x0;
LAB_00108933:
    __ptr->netmask = __dest_00;
    if (broadaddr == (sockaddr *)0x0) {
      __dest_01 = (sockaddr *)0x0;
    }
    else {
      __dest_01 = (sockaddr *)malloc(broadaddr_size);
      if (__dest_01 == (sockaddr *)0x0) {
        piVar2 = __errno_location();
        pcVar3 = pcap_strerror(*piVar2);
        snprintf(errbuf,0x100,"malloc: %s",pcVar3);
        if (__dest_00 != (sockaddr *)0x0) {
          free(__dest_00);
        }
        goto joined_r0x00108a67;
      }
      memcpy(__dest_01,broadaddr,broadaddr_size);
    }
    __ptr->broadaddr = __dest_01;
    if (dstaddr == (sockaddr *)0x0) {
      __dest_02 = (sockaddr *)0x0;
LAB_00108a01:
      __ptr->dstaddr = __dest_02;
      ppVar1 = curdev->addresses;
      do {
        ppVar4 = ppVar1;
        if (ppVar4 == (pcap_addr *)0x0) {
          curdev->addresses = __ptr;
          return 0;
        }
        ppVar1 = ppVar4->next;
      } while (ppVar4->next != (pcap_addr *)0x0);
      ppVar4->next = __ptr;
      return 0;
    }
    __dest_02 = (sockaddr *)malloc(dstaddr_size);
    if (__dest_02 != (sockaddr *)0x0) {
      memcpy(__dest_02,dstaddr,dstaddr_size);
      goto LAB_00108a01;
    }
    piVar2 = __errno_location();
    pcVar3 = pcap_strerror(*piVar2);
    snprintf(errbuf,0x100,"malloc: %s",pcVar3);
    if (__dest_01 != (sockaddr *)0x0) {
      free(__dest_01);
    }
    if (__dest_00 != (sockaddr *)0x0) {
      free(__dest_00);
    }
  }
  else {
    __dest_00 = (sockaddr *)malloc(netmask_size);
    if (__dest_00 != (sockaddr *)0x0) {
      memcpy(__dest_00,netmask,netmask_size);
      goto LAB_00108933;
    }
    piVar2 = __errno_location();
    pcVar3 = pcap_strerror(*piVar2);
    snprintf(errbuf,0x100,"malloc: %s",pcVar3);
  }
joined_r0x00108a67:
  if (__dest != (sockaddr *)0x0) {
    free(__dest);
  }
LAB_00108abd:
  free(__ptr);
  return -1;
}

Assistant:

int
add_addr_to_dev(pcap_if_t *curdev,
    struct sockaddr *addr, size_t addr_size,
    struct sockaddr *netmask, size_t netmask_size,
    struct sockaddr *broadaddr, size_t broadaddr_size,
    struct sockaddr *dstaddr, size_t dstaddr_size,
    char *errbuf)
{
	pcap_addr_t *curaddr, *prevaddr, *nextaddr;

	curaddr = malloc(sizeof(pcap_addr_t));
	if (curaddr == NULL) {
		(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
		    "malloc: %s", pcap_strerror(errno));
		return (-1);
	}

	curaddr->next = NULL;
	if (addr != NULL) {
		curaddr->addr = dup_sockaddr(addr, addr_size);
		if (curaddr->addr == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->addr = NULL;

	if (netmask != NULL) {
		curaddr->netmask = dup_sockaddr(netmask, netmask_size);
		if (curaddr->netmask == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			if (curaddr->addr != NULL)
				free(curaddr->addr);
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->netmask = NULL;

	if (broadaddr != NULL) {
		curaddr->broadaddr = dup_sockaddr(broadaddr, broadaddr_size);
		if (curaddr->broadaddr == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			if (curaddr->netmask != NULL)
				free(curaddr->netmask);
			if (curaddr->addr != NULL)
				free(curaddr->addr);
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->broadaddr = NULL;

	if (dstaddr != NULL) {
		curaddr->dstaddr = dup_sockaddr(dstaddr, dstaddr_size);
		if (curaddr->dstaddr == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			if (curaddr->broadaddr != NULL)
				free(curaddr->broadaddr);
			if (curaddr->netmask != NULL)
				free(curaddr->netmask);
			if (curaddr->addr != NULL)
				free(curaddr->addr);
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->dstaddr = NULL;

	/*
	 * Find the end of the list of addresses.
	 */
	for (prevaddr = curdev->addresses; prevaddr != NULL; prevaddr = nextaddr) {
		nextaddr = prevaddr->next;
		if (nextaddr == NULL) {
			/*
			 * This is the end of the list.
			 */
			break;
		}
	}

	if (prevaddr == NULL) {
		/*
		 * The list was empty; this is the first member.
		 */
		curdev->addresses = curaddr;
	} else {
		/*
		 * "prevaddr" is the last member of the list; append
		 * this member to it.
		 */
		prevaddr->next = curaddr;
	}

	return (0);
}